

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicTypeCase::BlockBasicTypeCase
          (BlockBasicTypeCase *this,Context *context,char *name,char *description,VarType *type,
          deUint32 layoutFlags,int numInstances)

{
  BufferBlock *this_00;
  BufferVar local_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,context->m_testCtx,context->m_renderCtx,name,
             glcts::fixed_sample_locations_values + 1,GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_01e4bb48;
  this_00 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  bb::BufferVar::BufferVar(&local_68,"var",(VarType *)description,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (&this_00->m_variables,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  this_00->m_flags = (deUint32)type;
  if (0 < (int)layoutFlags) {
    bb::BufferBlock::setArraySize(this_00,layoutFlags);
    std::__cxx11::string::assign((char *)&this_00->m_instanceName);
  }
  return;
}

Assistant:

BlockBasicTypeCase (Context& context, const char* name, const char* description, const VarType& type, deUint32 layoutFlags, int numInstances)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", type, ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setArraySize(numInstances);
			block.setInstanceName("block");
		}
	}